

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall
helics::CoreBroker::findAndNotifyFilterTargets
          (CoreBroker *this,BasicHandleInfo *handleInfo,string *key)

{
  UnknownHandleManager *this_00;
  pointer pbVar1;
  pointer ppVar2;
  uint uVar3;
  pointer ppVar4;
  pointer pbVar5;
  string_view name;
  string_view name_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  FiltSourceTargets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  FiltDestTargets;
  ActionMessage link;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  Handles;
  
  this_00 = &this->unknownHandles;
  UnknownHandleManager::checkForFilters
            ((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
              *)&Handles,this_00,(string *)key);
  ppVar2 = Handles.
           super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = Handles.
                super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar2; ppVar4 = ppVar4 + 1) {
    link._0_8_ = ppVar4->first;
    link.source_id.gid = -2000000000;
    link.source_handle.hid = 0x65;
    link._16_8_ = &link.actionTime;
    link.counter = 0;
    link.flags = 0;
    link.sequenceID = 0;
    link.actionTime.internalTimeCode._0_1_ = 0;
    link.Tdemin.internalTimeCode = (baseType)&link.payload;
    link.Tso.internalTimeCode = 0;
    link.payload.buffer._M_elems[0] = 0;
    link.payload.buffer._M_elems._16_8_ = link.payload.buffer._M_elems + 0x20;
    link.payload.buffer._M_elems[0x18] = 0;
    link.payload.buffer._M_elems[0x19] = 0;
    link.payload.buffer._M_elems[0x1a] = 0;
    link.payload.buffer._M_elems[0x1b] = 0;
    link.payload.buffer._M_elems[0x1c] = 0;
    link.payload.buffer._M_elems[0x1d] = 0;
    link.payload.buffer._M_elems[0x1e] = 0;
    link.payload.buffer._M_elems[0x1f] = 0;
    uVar3 = handleInfo->flags & 0x200 | (uint)ppVar4->second;
    link.payload.buffer._M_elems[0x20] = 0;
    link.payload.buffer._M_elems._48_8_ = &link.Tdemin;
    link.payload.buffer._M_elems._56_8_ = link.payload.buffer._M_elems + 0x10;
    link.payload.bufferSize = 0;
    link.payload.bufferCapacity = 0;
    link.payload.heap = (byte *)0x0;
    connectInterfaces(this,handleInfo,uVar3,(BasicHandleInfo *)&link,uVar3,
                      (pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
                       )0x5a0000003e);
    BasicHandleInfo::~BasicHandleInfo((BasicHandleInfo *)&link);
  }
  UnknownHandleManager::checkForFilterDestTargets(&FiltDestTargets,this_00,(string *)key);
  pbVar1 = FiltDestTargets.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = FiltDestTargets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1) {
    ActionMessage::ActionMessage(&link,cmd_add_named_endpoint);
    name._M_str = (pbVar5->_M_dataplus)._M_p;
    name._M_len = pbVar5->_M_string_length;
    ActionMessage::name(&link,name);
    link._8_8_ = handleInfo->handle;
    link._24_8_ = CONCAT44(link.sequenceID,CONCAT22(handleInfo->flags,link.counter)) | 0x20000;
    checkForNamedInterface(this,&link);
    ActionMessage::~ActionMessage(&link);
  }
  UnknownHandleManager::checkForFilterSourceTargets(&FiltSourceTargets,this_00,(string *)key);
  pbVar1 = FiltSourceTargets.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = FiltSourceTargets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1) {
    ActionMessage::ActionMessage(&link,cmd_add_named_endpoint);
    name_00._M_str = (pbVar5->_M_dataplus)._M_p;
    name_00._M_len = pbVar5->_M_string_length;
    ActionMessage::name(&link,name_00);
    link.flags = handleInfo->flags;
    link._8_8_ = handleInfo->handle;
    checkForNamedInterface(this,&link);
    ActionMessage::~ActionMessage(&link);
  }
  if (((Handles.
        super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        Handles.
        super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) ||
      (FiltDestTargets.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       FiltDestTargets.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) ||
     (FiltSourceTargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      FiltSourceTargets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    UnknownHandleManager::clearFilter(this_00,(string *)key);
  }
  if ((this->super_BrokerBase).brokerState._M_i == OPERATING) {
    UnknownHandleManager::checkForFilters
              ((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                *)&link,this_00,(string *)key);
    CLI::std::
    vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ::_M_move_assign(&Handles,&link);
    CLI::std::
    _Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ::~_Vector_base((_Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                     *)&link);
    for (; Handles.
           super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           Handles.
           super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        Handles.
        super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             Handles.
             super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) {
      link._0_8_ = (Handles.
                    super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->first;
      link.source_id.gid = -2000000000;
      link.source_handle.hid = 0x65;
      link._16_8_ = &link.actionTime;
      link.counter = 0;
      link.flags = 0;
      link.sequenceID = 0;
      link.actionTime.internalTimeCode._0_1_ = 0;
      link.Tdemin.internalTimeCode = (baseType)&link.payload;
      link.Tso.internalTimeCode = 0;
      link.payload.buffer._M_elems[0] = 0;
      link.payload.buffer._M_elems._16_8_ = link.payload.buffer._M_elems + 0x20;
      link.payload.buffer._M_elems[0x18] = 0;
      link.payload.buffer._M_elems[0x19] = 0;
      link.payload.buffer._M_elems[0x1a] = 0;
      link.payload.buffer._M_elems[0x1b] = 0;
      link.payload.buffer._M_elems[0x1c] = 0;
      link.payload.buffer._M_elems[0x1d] = 0;
      link.payload.buffer._M_elems[0x1e] = 0;
      link.payload.buffer._M_elems[0x1f] = 0;
      uVar3 = handleInfo->flags & 0x200 |
              (uint)(Handles.
                     super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second;
      link.payload.buffer._M_elems[0x20] = 0;
      link.payload.buffer._M_elems._48_8_ = &link.Tdemin;
      link.payload.buffer._M_elems._56_8_ = link.payload.buffer._M_elems + 0x10;
      link.payload.bufferSize = 0;
      link.payload.bufferCapacity = 0;
      link.payload.heap = (byte *)0x0;
      connectInterfaces(this,handleInfo,uVar3,(BasicHandleInfo *)&link,uVar3,
                        (pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
                         )0x5a0000003e);
      BasicHandleInfo::~BasicHandleInfo((BasicHandleInfo *)&link);
    }
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&FiltSourceTargets);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&FiltDestTargets);
  CLI::std::
  _Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  ::~_Vector_base(&Handles.
                   super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                 );
  return;
}

Assistant:

void CoreBroker::findAndNotifyFilterTargets(BasicHandleInfo& handleInfo, const std::string& key)
{
    auto Handles = unknownHandles.checkForFilters(key);
    for (const auto& target : Handles) {
        auto flags = target.second;
        if (checkActionFlag(handleInfo, clone_flag)) {
            flags |= make_flags(clone_flag);
        }
        connectInterfaces(handleInfo,
                          flags,
                          BasicHandleInfo(target.first.fed_id,
                                          target.first.handle,
                                          InterfaceType::ENDPOINT),

                          flags,
                          std::make_pair(CMD_ADD_FILTER, CMD_ADD_ENDPOINT));
    }

    auto FiltDestTargets = unknownHandles.checkForFilterDestTargets(key);
    for (const auto& target : FiltDestTargets) {
        ActionMessage link(CMD_ADD_NAMED_ENDPOINT);
        link.name(target);
        link.setSource(handleInfo.handle);
        link.flags = handleInfo.flags;
        setActionFlag(link, destination_target);
        if (checkActionFlag(handleInfo, clone_flag)) {
            setActionFlag(link, clone_flag);
        }
        checkForNamedInterface(link);
    }

    auto FiltSourceTargets = unknownHandles.checkForFilterSourceTargets(key);
    for (const auto& target : FiltSourceTargets) {
        ActionMessage link(CMD_ADD_NAMED_ENDPOINT);
        link.name(target);
        link.flags = handleInfo.flags;
        link.setSource(handleInfo.handle);
        if (checkActionFlag(handleInfo, clone_flag)) {
            setActionFlag(link, clone_flag);
        }
        checkForNamedInterface(link);
    }
    if (!(Handles.empty() && FiltDestTargets.empty() && FiltSourceTargets.empty())) {
        unknownHandles.clearFilter(key);
    }
    if (getBrokerState() == BrokerState::OPERATING) {
        Handles = unknownHandles.checkForFilters(key);
        for (const auto& target : Handles) {
            auto flags = target.second;
            if (checkActionFlag(handleInfo, clone_flag)) {
                flags |= make_flags(clone_flag);
            }
            connectInterfaces(handleInfo,
                              flags,
                              BasicHandleInfo(target.first.fed_id,
                                              target.first.handle,
                                              InterfaceType::ENDPOINT),

                              flags,
                              std::make_pair(CMD_ADD_FILTER, CMD_ADD_ENDPOINT));
        }
    }
}